

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RhoR.cpp
# Opt level: O0

void __thiscall OpenMD::RhoR::process(RhoR *this)

{
  bool bVar1;
  int iVar2;
  SnapshotManager *this_00;
  Snapshot *pSVar3;
  reference pvVar4;
  long in_RDI;
  SelectionEvaluator *this_01;
  int whichBin;
  RealType distance;
  Vector3d r12;
  Vector3d pos;
  Vector3d CenterOfMass;
  StuntDouble *sd;
  int i;
  int istep;
  int nFrames;
  DumpReader reader;
  Thermo thermo;
  Vector<double,_3U> *in_stack_ffffffffffffec58;
  DumpReader *in_stack_ffffffffffffec60;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffec68;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffec70;
  RhoR *this_02;
  int in_stack_ffffffffffffecec;
  DumpReader *in_stack_ffffffffffffecf0;
  Thermo *in_stack_ffffffffffffed08;
  DumpReader *local_12c0;
  int local_12b0;
  RhoR *in_stack_ffffffffffffeeb0;
  SimInfo *in_stack_ffffffffffffeeb8;
  undefined8 in_stack_ffffffffffffeec0;
  Thermo local_10 [2];
  
  Thermo::Thermo(local_10,*(SimInfo **)(in_RDI + 8));
  this_02 = (RhoR *)&stack0xffffffffffffed98;
  DumpReader::DumpReader
            ((DumpReader *)in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8,
             (string *)in_stack_ffffffffffffeeb0);
  iVar2 = DumpReader::getNFrames(in_stack_ffffffffffffec60);
  *(int *)(in_RDI + 0xd0) = iVar2 / *(int *)(in_RDI + 0x30);
  std::vector<double,_std::allocator<double>_>::begin
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffec58);
  std::vector<double,_std::allocator<double>_>::end
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffec58);
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            (in_stack_ffffffffffffec70,in_stack_ffffffffffffec68,(double *)in_stack_ffffffffffffec60
            );
  this_01 = (SelectionEvaluator *)(in_RDI + 0x730);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec58);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffec58);
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             in_stack_ffffffffffffec70._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             in_stack_ffffffffffffec68._M_current,(int *)in_stack_ffffffffffffec60);
  for (local_12b0 = 0; local_12b0 < iVar2; local_12b0 = *(int *)(in_RDI + 0x30) + local_12b0) {
    DumpReader::readFrame(in_stack_ffffffffffffecf0,in_stack_ffffffffffffecec);
    this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 8));
    pSVar3 = SnapshotManager::getCurrentSnapshot(this_00);
    *(Snapshot **)(in_RDI + 200) = pSVar3;
    Thermo::getCom(in_stack_ffffffffffffed08);
    bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0xf8));
    if (bVar1) {
      SelectionEvaluator::evaluate(this_01);
      SelectionManager::setSelectionSet
                ((SelectionManager *)in_stack_ffffffffffffec70._M_current,
                 (SelectionSet *)in_stack_ffffffffffffec68._M_current);
      SelectionSet::~SelectionSet((SelectionSet *)0x1a1d30);
    }
    in_stack_ffffffffffffec70._M_current =
         (double *)
         SelectionManager::beginSelected
                   (in_stack_ffffffffffffec70._M_current,in_stack_ffffffffffffec68._M_current);
    local_12c0 = (DumpReader *)in_stack_ffffffffffffec70._M_current;
    while (local_12c0 != (DumpReader *)0x0) {
      StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffec68._M_current);
      OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffec68._M_current,
                        (Vector<double,_3U> *)in_stack_ffffffffffffec60);
      Vector3<double>::Vector3
                ((Vector3<double> *)in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
      in_stack_ffffffffffffec68._M_current =
           (double *)Vector<double,_3U>::length((Vector<double,_3U> *)0x1a1e01);
      if ((double)in_stack_ffffffffffffec68._M_current < *(double *)(in_RDI + 0x710)) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x730),
                            (long)(int)((double)in_stack_ffffffffffffec68._M_current /
                                       *(double *)(in_RDI + 0x720)));
        *pvVar4 = *pvVar4 + 1;
      }
      in_stack_ffffffffffffec60 =
           (DumpReader *)
           SelectionManager::nextSelected
                     ((SelectionManager *)in_stack_ffffffffffffec70._M_current,
                      (int *)in_stack_ffffffffffffec68._M_current);
      local_12c0 = in_stack_ffffffffffffec60;
    }
  }
  processHistogram(this_02);
  writeRhoR(in_stack_ffffffffffffeeb0);
  DumpReader::~DumpReader(in_stack_ffffffffffffec60);
  return;
}

Assistant:

void RhoR::process() {
    Thermo thermo(info_);
    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    std::fill(avgRhoR_.begin(), avgRhoR_.end(), 0.0);
    std::fill(histogram_.begin(), histogram_.end(), 0);

    for (int istep = 0; istep < nFrames; istep += step_) {
      int i;
      StuntDouble* sd;
      reader.readFrame(istep);
      currentSnapshot_      = info_->getSnapshotManager()->getCurrentSnapshot();
      Vector3d CenterOfMass = thermo.getCom();

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(i); sd != NULL;
           sd = seleMan_.nextSelected(i)) {
        Vector3d pos = sd->getPos();
        Vector3d r12 = CenterOfMass - pos;

        RealType distance = r12.length();

        if (distance < len_) {
          int whichBin = int(distance / deltaR_);
          histogram_[whichBin] += 1;
        }
      }
    }

    processHistogram();
    writeRhoR();
  }